

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

uchar __thiscall Memory::LargeObjectHeader::GetAttributes(LargeObjectHeader *this,uint cookie)

{
  uchar calculatedChecksum;
  ushort uVar1;
  LargeObjectHeader *decodedNext_00;
  uchar calculatedCheckSumField;
  uchar checkSum;
  ushort decodedAttributesAndChecksum;
  LargeObjectHeader *decodedNext;
  uint cookie_local;
  LargeObjectHeader *this_local;
  
  decodedNext_00 = DecodeNext(this,cookie,this->next);
  uVar1 = DecodeAttributesAndChecksum(this,cookie);
  calculatedChecksum = CalculateCheckSum(this,decodedNext_00,(uchar)(uVar1 >> 8));
  if ((uchar)uVar1 != calculatedChecksum) {
    LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this,calculatedChecksum);
  }
  uVar1 = DecodeAttributesAndChecksum(this,cookie);
  return (uchar)(uVar1 >> 8);
}

Assistant:

unsigned char
LargeObjectHeader::GetAttributes(uint cookie)
{
#ifdef LARGEHEAPBLOCK_ENCODING

    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    unsigned char checkSum = (unsigned char)(decodedAttributesAndChecksum & 0xFF);
    unsigned char calculatedCheckSumField = this->CalculateCheckSum(decodedNext, (unsigned char)(decodedAttributesAndChecksum >> 8));
    if (checkSum != calculatedCheckSumField)
    {
        LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this, calculatedCheckSumField);
    }

    // If checksum matches return the up-to-date attributes (in case other thread changed it from last time
    // we read it in this method.
    return this->DecodeAttributesAndChecksum(cookie) >> 8;
#else
    return this->attributes;
#endif
}